

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse_levinson_durbin_recursion.cc
# Opt level: O3

bool __thiscall
sptk::ReverseLevinsonDurbinRecursion::Run
          (ReverseLevinsonDurbinRecursion *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *autocorrelation,Buffer *buffer)

{
  SymmetricMatrix *this_00;
  long lVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  int iVar11;
  size_type __new_size;
  ulong uVar12;
  size_type sVar13;
  ulong uVar14;
  double dVar15;
  Row local_78;
  long local_60;
  double *local_58;
  ReverseLevinsonDurbinRecursion *local_50;
  double *local_48;
  long local_40;
  ulong local_38;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (buffer == (Buffer *)0x0) {
    return false;
  }
  if (autocorrelation == (vector<double,_std::allocator<double>_> *)0x0) {
    return false;
  }
  lVar10 = (long)(linear_predictive_coefficients->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(linear_predictive_coefficients->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  sVar13 = (long)this->num_order_ + 1;
  __new_size = lVar10 >> 3;
  if (__new_size != sVar13) {
    return false;
  }
  local_50 = this;
  if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start != lVar10) {
    std::vector<double,_std::allocator<double>_>::resize(autocorrelation,__new_size);
  }
  this_00 = &buffer->u_;
  iVar11 = (int)sVar13;
  if ((buffer->u_).num_dimension_ != iVar11) {
    SymmetricMatrix::Resize(this_00,iVar11);
  }
  local_58 = (buffer->e_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((long)(buffer->e_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)local_58 != lVar10) {
    std::vector<double,_std::allocator<double>_>::resize(&buffer->e_,__new_size);
    local_58 = (buffer->e_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  pdVar8 = (linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_48 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_78.row_ = local_50->num_order_;
  if (-1 < local_78.row_) {
    iVar11 = -1;
    do {
      iVar11 = iVar11 + 1;
      local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
      local_78.matrix_ = this_00;
      local_78.row_ = iVar11;
      pdVar7 = SymmetricMatrix::Row::operator[](&local_78,iVar11);
      *pdVar7 = 1.0;
      local_78.row_ = local_50->num_order_;
    } while (iVar11 < local_78.row_);
    if (0 < local_78.row_) {
      lVar10 = 0;
      iVar11 = 0;
      do {
        dVar15 = pdVar8[lVar10 + local_78.row_];
        local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
        local_78.matrix_ = this_00;
        pdVar7 = SymmetricMatrix::Row::operator[](&local_78,iVar11);
        *pdVar7 = dVar15;
        iVar11 = iVar11 + 1;
        local_78.row_ = local_50->num_order_;
        lVar10 = lVar10 + -1;
      } while (iVar11 < local_78.row_);
      lVar10 = (long)local_78.row_;
      local_58[lVar10] = *pdVar8 * *pdVar8;
      if (0 < local_78.row_) {
        uVar14 = (ulong)(local_78.row_ - 1);
        local_60 = lVar10 * 8;
        do {
          local_60 = local_60 + -8;
          lVar1 = lVar10 + -1;
          local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
          local_78.row_ = (int)lVar10;
          local_78.matrix_ = this_00;
          local_38 = uVar14;
          pdVar8 = SymmetricMatrix::Row::operator[](&local_78,0);
          uVar14 = local_38;
          dVar15 = 1.0 / (1.0 - *pdVar8 * *pdVar8);
          if (lVar10 < 2) {
            local_58[lVar1] = dVar15 * local_58[lVar10];
            break;
          }
          pdVar7 = (double *)((long)pdVar8 + local_60);
          uVar12 = 0;
          local_40 = lVar10;
          do {
            uVar2 = uVar12 + 1;
            dVar3 = pdVar8[uVar12 + 1];
            dVar4 = *pdVar8;
            dVar5 = *pdVar7;
            local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
            local_78.row_ = (int)lVar1;
            local_78.matrix_ = this_00;
            pdVar9 = SymmetricMatrix::Row::operator[](&local_78,(int)uVar12);
            *pdVar9 = (dVar3 - dVar4 * dVar5) * dVar15;
            pdVar7 = pdVar7 + -1;
            uVar12 = uVar2;
          } while (uVar14 != uVar2);
          local_58[lVar1] = dVar15 * local_58[local_40];
          uVar14 = uVar14 - 1;
          lVar10 = lVar1;
        } while (1 < local_40);
        pdVar8 = local_48;
        iVar11 = local_50->num_order_;
        *local_48 = *local_58;
        if (0 < iVar11) {
          local_60 = 0;
          uVar14 = 1;
          do {
            dVar15 = 0.0;
            if (1 < uVar14) {
              lVar10 = local_60;
              do {
                local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
                lVar1 = lVar10 + -1;
                local_78.matrix_ = this_00;
                local_78.row_ = (int)uVar14 + -1;
                pdVar7 = SymmetricMatrix::Row::operator[](&local_78,(int)lVar1);
                dVar15 = dVar15 + *pdVar7 * pdVar8[lVar10];
                lVar10 = lVar1;
              } while (lVar1 != 0);
            }
            local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
            local_78.matrix_ = this_00;
            local_78.row_ = (int)uVar14;
            pdVar7 = SymmetricMatrix::Row::operator[](&local_78,0);
            pdVar8[uVar14] = -(*pdVar7 * local_58[uVar14 - 1] + dVar15);
            local_60 = local_60 + 1;
            bVar6 = (long)uVar14 < (long)local_50->num_order_;
            uVar14 = uVar14 + 1;
          } while (bVar6);
          return true;
        }
        return true;
      }
      goto LAB_00104e52;
    }
  }
  local_58[local_78.row_] = *pdVar8 * *pdVar8;
LAB_00104e52:
  *local_48 = *local_58;
  return true;
}

Assistant:

bool ReverseLevinsonDurbinRecursion::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* autocorrelation,
    ReverseLevinsonDurbinRecursion::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(length) ||
      NULL == autocorrelation || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (autocorrelation->size() != static_cast<std::size_t>(length)) {
    autocorrelation->resize(length);
  }
  if (buffer->u_.GetNumDimension() != length) {
    buffer->u_.Resize(length);
  }
  if (buffer->e_.size() != static_cast<std::size_t>(length)) {
    buffer->e_.resize(length);
  }

  const double* a(&(linear_predictive_coefficients[0]));
  double* r(&((*autocorrelation)[0]));
  double* e(&(buffer->e_[0]));

  for (int j(0); j <= num_order_; ++j) {
    buffer->u_[j][j] = 1.0;
  }
  for (int j(0); j < num_order_; ++j) {
    buffer->u_[num_order_][j] = a[num_order_ - j];
  }
  e[num_order_] = a[0] * a[0];

  for (int i(num_order_ - 1); 0 <= i; --i) {
    const double* u(&(buffer->u_[i + 1][0]));
    const double t(1.0 / (1.0 - u[0] * u[0]));
    for (int j(0); j < i; ++j) {
      buffer->u_[i][j] = (u[j + 1] - u[0] * u[i - j]) * t;
    }
    e[i] = e[i + 1] * t;
  }

  r[0] = e[0];
  for (int i(1); i <= num_order_; ++i) {
    double sum(0.0);
    for (int j(1); j < i; ++j) {
      sum += buffer->u_[i - 1][i - j - 1] * r[i - j];
    }
    r[i] = -(sum + buffer->u_[i][0] * e[i - 1]);
  }

  return true;
}